

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O3

void __thiscall
MT32Emu::Display::displayControlMessageReceived(Display *this,Bit8u *messageBytes,Bit32u length)

{
  bool bVar1;
  Bit32u startIndex;
  Bit8u emptyMessage [1];
  Bit8u local_19;
  
  local_19 = '\0';
  bVar1 = Synth::isDisplayOldMT32Compatible(this->synth);
  if (bVar1) {
    if (length == 1) {
      customDisplayMessageReceived(this,this->customMessageBuffer,0,0x14);
      return;
    }
    startIndex = 0;
  }
  else if (length == 1) {
    this->customMessageBuffer[0] = '\0';
    startIndex = 0x80;
  }
  else {
    if (length != 2) {
      return;
    }
    startIndex = (uint)messageBytes[1] << 7;
  }
  customDisplayMessageReceived(this,&local_19,startIndex,0);
  return;
}

Assistant:

void Display::displayControlMessageReceived(const Bit8u *messageBytes, Bit32u length) {
	Bit8u emptyMessage[] = { 0 };
	if (synth.isDisplayOldMT32Compatible()) {
		if (length == 1) {
			customDisplayMessageReceived(customMessageBuffer, 0, LCD_TEXT_SIZE);
		} else {
			customDisplayMessageReceived(emptyMessage, 0, 0);
		}
	} else {
		// Always assume the third byte to be zero for simplicity.
		if (length == 2) {
			customDisplayMessageReceived(emptyMessage, messageBytes[1] << 7, 0);
		} else if (length == 1) {
			customMessageBuffer[0] = 0;
			customDisplayMessageReceived(emptyMessage, 0x80, 0);
		}
	}
}